

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error contentProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Bool XVar1;
  XML_Error result;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  parser_local._4_4_ =
       doContent(parser,0,parser->m_encoding,start,end,endPtr,
                 ((parser->m_parsingStatus).finalBuffer != '\0' ^ 0xffU) & 1);
  if ((parser_local._4_4_ == XML_ERROR_NONE) && (XVar1 = storeRawNames(parser), XVar1 == '\0')) {
    parser_local._4_4_ = XML_ERROR_NO_MEMORY;
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
contentProcessor(XML_Parser parser,
                 const char *start,
                 const char *end,
                 const char **endPtr)
{
  enum XML_Error result = doContent(parser, 0, encoding, start, end,
                                    endPtr, (XML_Bool)!ps_finalBuffer);
  if (result == XML_ERROR_NONE) {
    if (!storeRawNames(parser))
      return XML_ERROR_NO_MEMORY;
  }
  return result;
}